

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O3

void xmlRelaxNGFreeValidState(xmlRelaxNGValidCtxtPtr ctxt,xmlRelaxNGValidStatePtr state)

{
  int iVar1;
  xmlRelaxNGStatesPtr pxVar2;
  xmlRelaxNGValidStatePtr *ppxVar3;
  int iVar4;
  
  if (state != (xmlRelaxNGValidStatePtr)0x0) {
    if (ctxt == (xmlRelaxNGValidCtxtPtr)0x0) {
LAB_001811b8:
      if (state->attrs != (xmlAttrPtr *)0x0) {
        (*xmlFree)(state->attrs);
      }
      (*xmlFree)(state);
      return;
    }
    pxVar2 = ctxt->freeState;
    if (pxVar2 == (xmlRelaxNGStatesPtr)0x0) {
      pxVar2 = xmlRelaxNGNewStates(ctxt,0x28);
      ctxt->freeState = pxVar2;
      if (pxVar2 == (xmlRelaxNGStatesPtr)0x0) goto LAB_001811b8;
    }
    iVar4 = pxVar2->nbState;
    iVar1 = pxVar2->maxState;
    if (iVar4 < iVar1) {
      ppxVar3 = pxVar2->tabState;
    }
    else {
      ppxVar3 = (xmlRelaxNGValidStatePtr *)(*xmlRealloc)(pxVar2->tabState,(long)iVar1 << 4);
      if (ppxVar3 == (xmlRelaxNGValidStatePtr *)0x0) {
        xmlRngVErrMemory(ctxt);
        return;
      }
      pxVar2->tabState = ppxVar3;
      pxVar2->maxState = iVar1 * 2;
      iVar4 = pxVar2->nbState;
    }
    pxVar2->nbState = iVar4 + 1;
    ppxVar3[iVar4] = state;
  }
  return;
}

Assistant:

static void
xmlRelaxNGFreeValidState(xmlRelaxNGValidCtxtPtr ctxt,
                         xmlRelaxNGValidStatePtr state)
{
    if (state == NULL)
        return;

    if ((ctxt != NULL) && (ctxt->freeState == NULL)) {
        ctxt->freeState = xmlRelaxNGNewStates(ctxt, 40);
    }
    if ((ctxt == NULL) || (ctxt->freeState == NULL)) {
        if (state->attrs != NULL)
            xmlFree(state->attrs);
        xmlFree(state);
    } else {
        xmlRelaxNGAddStatesUniq(ctxt, ctxt->freeState, state);
    }
}